

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

pair<unsigned_int,_unsigned_int> __thiscall
suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::initial_bucketing(suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                    *this,uint k)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  ostream *poVar4;
  unsigned_long uVar5;
  ulong *puVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  pair<unsigned_int,_unsigned_int> pVar10;
  byte *pbVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  unsigned_long local_88;
  comm *local_80;
  uint local_74;
  ulong local_70;
  ulong local_68;
  vector<unsigned_short,_std::allocator<unsigned_short>_> alphabet_mapping;
  vector<unsigned_long,_std::allocator<unsigned_long>_> alphabet_hist;
  
  uVar13 = (this->part).div + (ulong)((long)this->p - 1U < (this->part).mod);
  alphabet_histogram<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long>
            (&alphabet_hist,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(this->input_begin)._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(this->input_end)._M_current,&this->comm);
  alphabet_mapping_tbl<unsigned_long>(&alphabet_mapping,&alphabet_hist);
  local_80 = &this->comm;
  uVar3 = alphabet_unique_chars<unsigned_long>(&alphabet_hist);
  uVar9 = 0x20;
  if (uVar3 != 0) {
    uVar9 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = uVar9 ^ 0x1f;
  }
  uVar3 = 0x20 - uVar9;
  bVar7 = (byte)uVar3;
  bVar2 = 0x40 / bVar7;
  local_68 = (ulong)(uint)bVar2;
  if (k - 1 < (uint)bVar2) {
    local_68 = (ulong)k;
  }
  if (bVar2 < k) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"[WARNING] given `k` value of ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," is too large, setting k=");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," instead.");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_68 = (ulong)(uint)bVar2;
  }
  if (uVar13 <= local_68) {
    local_68 = (ulong)((int)uVar13 - (uint)(1 < uVar13 && (this->comm).m_size == 1));
  }
  iVar14 = (int)local_68;
  if ((this->comm).m_rank == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Detecting sigma=");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," => l=");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,", k=");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  local_70 = -1L << ((byte)(iVar14 * uVar3) & 0x3f);
  pbVar11 = (byte *)(this->input_begin)._M_current;
  local_88 = 0;
  local_74 = iVar14 - 1;
  uVar12 = local_74;
  while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
    local_88 = local_88 << (bVar7 & 0x3f) |
               (ulong)alphabet_mapping.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start[*pbVar11];
    pbVar11 = pbVar11 + 1;
  }
  uVar5 = mxx::left_shift<unsigned_long>(&local_88,local_80);
  puVar6 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((long)(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3 != this->local_size) {
    local_80 = (comm *)&this->local_B;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80,this->local_size);
    puVar6 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80->_vptr_comm)
             ->_M_impl).super__Vector_impl_data._M_start;
  }
  uVar13 = -(ulong)(iVar14 * uVar3 == 0) | ~local_70;
  pbVar1 = (byte *)(this->input_end)._M_current;
  for (; pbVar11 != pbVar1; pbVar11 = pbVar11 + 1) {
    local_88 = ((ulong)alphabet_mapping.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start[*pbVar11] | local_88 << (bVar7 & 0x3f)) &
               uVar13;
    *puVar6 = local_88;
    puVar6 = puVar6 + 1;
  }
  uVar8 = 0;
  if ((this->comm).m_size + -1 <= (this->comm).m_rank) {
    uVar5 = uVar8;
  }
  iVar14 = (iVar14 + -2) * uVar3;
  for (; local_74 != uVar8; uVar8 = uVar8 + 1) {
    local_88 = (uVar5 >> ((byte)iVar14 & 0x3f) | local_88 << (bVar7 & 0x3f)) & uVar13;
    puVar6[uVar8] = local_88;
    iVar14 = iVar14 + (uVar9 - 0x20);
  }
  pVar10 = (pair<unsigned_int,_unsigned_int>)(local_68 | (ulong)uVar3 << 0x20);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&alphabet_mapping.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&alphabet_hist.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return pVar10;
}

Assistant:

std::pair<unsigned int, unsigned int> initial_bucketing(unsigned int k = 0)
{
    std::size_t min_local_size = part.local_size(p-1);

    // get global alphabet histogram
    std::vector<index_t> alphabet_hist = alphabet_histogram<InputIterator, index_t>(input_begin, input_end, comm);
    // get mapping table and alphabet sizes
    std::vector<uint16_t> alphabet_mapping = alphabet_mapping_tbl(alphabet_hist);
    unsigned int sigma = alphabet_unique_chars(alphabet_hist);
    // bits per character: set l=ceil(log(sigma))
    unsigned int l = alphabet_bits_per_char(sigma);
    // number of characters per word => the `k` in `k-mer`
    unsigned int opt_k = alphabet_chars_per_word<index_t>(l);
    if (k == 0 || k > opt_k) {
        if (k > opt_k)
            std::cerr << "[WARNING] given `k` value of " << k << " is too large, setting k=" << opt_k << " instead." << std::endl;
        k = opt_k;
    }
    // if the input is too small for `k`, choose a smaller `k`
    if (k >= min_local_size) {
        k = min_local_size;
        if (comm.size() == 1 && k > 1)
            k--;
    }

    if (comm.rank() == 0)
        INFO("Detecting sigma=" << sigma << " => l=" << l << ", k=" << k);

    // get k-mer mask
    index_t kmer_mask = ((static_cast<index_t>(1) << (l*k)) - static_cast<index_t>(1));
    if (kmer_mask == 0)
        kmer_mask = ~static_cast<index_t>(0);

    // sliding window k-mer (for prototype only using ASCII alphabet)

    // fill first k-mer (until k-1 positions) and send to left processor
    // filling k-mer with first character = MSBs for lexicographical ordering
    InputIterator str_it = input_begin;
    index_t kmer = 0;
    for (unsigned int i = 0; i < k-1; ++i) {
        kmer <<= l;
        index_t s = (unsigned char)(*str_it);
        kmer |= alphabet_mapping[s];
        ++str_it;
    }

    // send first kmer to left processor
    // TODO: use async left shift!
    index_t last_kmer = mxx::left_shift(kmer, comm);

    // init output
    if (local_B.size() != local_size)
        local_B.resize(local_size);
    auto buk_it = local_B.begin();
    // continue to create all k-mers and add into histogram count
    while (str_it != input_end) {
        // get next kmer
        kmer <<= l;
        index_t s = (unsigned char)(*str_it);
        kmer |= alphabet_mapping[s];
        kmer &= kmer_mask;
        // add to bucket number array
        *buk_it = kmer;
        // increase iterators
        ++str_it;
        ++buk_it;
    }

    // finish the receive to get the last k-1 k-kmers with string data from the
    // processor to the right
    // if not last processor
    if (comm.rank() < comm.size()-1) {
        // TODO: use mxx::future to handle this async left shift
        // wait for the async receive to finish
        //MPI_Wait(&recv_req, MPI_STATUS_IGNORE);
        //req.wait();
    } else {
        // in this case the last k-mers contains shifting `$` signs
        // we assume this to be the `\0` value
        last_kmer = 0;
    }


    // construct last (k-1) k-mers
    for (unsigned int i = 0; i < k-1; ++i) {
        kmer <<= l;
        kmer |= (last_kmer >> (l*(k-i-2)));
        kmer &= kmer_mask;

        // add to bucket number array
        *buk_it = kmer;
        ++buk_it;
    }

    // return the number of characters which are part of each bucket number
    // (i.e., k-mer)
    return std::make_pair(k, l);
}